

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shader.c
# Opt level: O2

_Bool al_set_shader_sampler(char *name,ALLEGRO_BITMAP *bitmap,int unit)

{
  ALLEGRO_SHADER *pAVar1;
  _Bool _Var2;
  ALLEGRO_BITMAP *pAVar3;
  
  pAVar3 = al_get_target_bitmap();
  if ((pAVar3 != (ALLEGRO_BITMAP *)0x0) &&
     (pAVar1 = pAVar3->shader, pAVar1 != (ALLEGRO_SHADER *)0x0)) {
    _Var2 = (*pAVar1->vt->set_shader_sampler)(pAVar1,name,bitmap,unit);
    return _Var2;
  }
  return false;
}

Assistant:

bool al_set_shader_sampler(const char *name,
   ALLEGRO_BITMAP *bitmap, int unit)
{
   ALLEGRO_BITMAP *bmp;
   ALLEGRO_SHADER *shader;

   if ((bmp = al_get_target_bitmap()) != NULL) {
      if ((shader = bmp->shader) != NULL) {
         return shader->vt->set_shader_sampler(shader, name, bitmap, unit);
      }
      else {
         return false;
      }
   }
   else {
      return false;
   }
}